

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polpak.cpp
# Opt level: O2

double zernike_poly(int m,int n,double rho)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  
  dVar8 = 0.0;
  if ((m <= n && -1 < (n | m)) && ((n - m & 0x80000001U) != 1)) {
    dVar8 = pow(rho,(double)m);
    if (m == 0) {
      if (n != 0) {
        iVar2 = 0xc;
        dVar11 = 2.0;
        dVar9 = dVar8;
        dVar8 = (rho + rho) * rho + -1.0;
        iVar4 = 2;
        while (iVar4 <= n + -2) {
          iVar3 = iVar4 + 2;
          dVar12 = (double)(iVar4 * iVar4) / dVar11;
          dVar11 = dVar11 + 2.0;
          dVar13 = (double)iVar2;
          dVar10 = dVar9 * dVar12;
          iVar2 = iVar2 + 8;
          dVar9 = dVar8;
          dVar8 = ((dVar13 * rho * rho - ((double)(iVar3 * iVar3) / (double)iVar3 + dVar12)) * dVar8
                  - dVar10) * ((double)iVar3 / (double)(iVar3 * iVar3));
          iVar4 = iVar3;
        }
      }
    }
    else {
      iVar2 = m * 4 + 4;
      iVar3 = m * 2;
      iVar4 = 2;
      dVar9 = dVar8;
      dVar11 = 0.0;
      iVar7 = m;
      while (dVar8 = dVar9, iVar7 <= n + -2) {
        iVar1 = iVar7 + 2;
        dVar9 = (double)iVar2;
        iVar5 = iVar3 * iVar3;
        iVar6 = iVar4 * iVar4;
        iVar2 = iVar2 + 8;
        iVar3 = iVar3 + 2;
        iVar4 = iVar4 + 2;
        dVar9 = ((dVar9 * rho * rho -
                 ((double)iVar6 / (double)iVar1 + (double)iVar5 / (double)iVar7)) * dVar8 -
                dVar11 * ((double)(iVar7 * iVar7 - m * m) / (double)iVar7)) *
                ((double)iVar1 / (double)(iVar1 * iVar1 - m * m));
        dVar11 = dVar8;
        iVar7 = iVar1;
      }
    }
  }
  return dVar8;
}

Assistant:

BURKHARDT_EXPORT
double zernike_poly ( int m, int n, double rho )

//****************************************************************************80
//
//  Purpose:
//
//    ZERNIKE_POLY evaluates a Zernike polynomial at RHO.
//
//  Discussion:
//
//    This routine uses the facts that:
//
//    *) R^M_N = 0 if M < 0, or N < 0, or N < M.
//    *) R^M_M = RHO^M
//    *) R^M_N = 0 if mod ( N - M, 2 ) = 1.
//
//    and the recursion:
//
//    R^M_(N+2) = A * [ ( B * RHO^2 - C ) * R^M_N - D * R^M_(N-2) ]
//
//    where
//
//    A = ( N + 2 ) / ( ( N + 2 )^2 - M^2 )
//    B = 4 * ( N + 1 )
//    C = ( N + M )^2 / N + ( N - M + 2 )^2 / ( N + 2 )
//    D = ( N^2 - M^2 ) / N
//
//    I wish I could clean up the recursion in the code, but for
//    now, I have to treat the case M = 0 specially.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license. 
//
//  Modified:
//
//    11 November 2005
//
//  Author:
//
//    John Burkardt
//
//  Reference:
//
//    Eric Weisstein,
//    CRC Concise Encyclopedia of Mathematics,
//    CRC Press, 2002,
//    Second edition,
//    ISBN: 1584883472,
//    LC: QA5.W45.
//
//  Parameters:
//
//    Input, int M, the upper index.
//
//    Input, int N, the lower index.
//
//    Input, double RHO, the radial coordinate.
//
//    Output, double ZERNIKE_POLY, the value of the Zernike
//    polynomial R^M_N at the point RHO.
//
{
  double a;
  double b;
  double c;
  double d;
  int nn;
  double z;
  double zm2;
  double zp2;
//
//  Do checks.
//
  if ( m < 0 )
  {
    z = 0.0;
    return z;
  }

  if ( n < 0 )
  {
    z = 0.0;
    return z;
  }

  if ( n < m )
  {
    z = 0.0;
    return z;
  }

  if ( ( n - m ) % 2 == 1 )
  {
    z = 0.0;
    return z;
  }

  zm2 = 0.0;
  z = pow ( rho, m );

  if ( m == 0 )
  {
    if ( n == 0 )
    {
      return z;
    }

    zm2 = z;
    z = 2.0 * rho * rho - 1.0;

    for ( nn = m+2; nn <= n-2; nn = nn + 2 )
    {
      a = double( nn + 2 ) 
        / double( ( nn + 2 ) * ( nn + 2 ) - m * m );

      b = double( 4 * ( nn + 1 ) );

      c = double( ( nn + m ) * ( nn + m ) ) / double( nn ) 
        + double( ( nn - m + 2 ) * ( nn - m + 2 ) ) 
        / double( nn + 2 );

      d = double( nn * nn - m * m ) / double( nn );

      zp2 = a * ( ( b * rho * rho - c ) * z - d * zm2 );
      zm2 = z;
      z = zp2;
    }
  }
  else
  {
    for ( nn = m; nn <= n-2; nn = nn + 2 )
    {
      a = double( nn + 2 ) 
        / double( ( nn + 2 ) * ( nn + 2 ) - m * m );

      b = double( 4 * ( nn + 1 ) );

      c = double( ( nn + m ) * ( nn + m ) ) / double( nn ) 
        + double( ( nn - m + 2 ) * ( nn - m + 2 ) ) 
        / double( nn + 2 );

      d = double( nn * nn - m * m ) / double( nn );

      zp2 = a * ( ( b * rho * rho - c ) * z - d * zm2 );
      zm2 = z;
      z = zp2;
    }
  }

  return z;
}